

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimeenc.c
# Opt level: O0

int charset_from_mimeenc(char *name)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte *local_30;
  char *q;
  char *p;
  int i;
  char *name_local;
  
  p._4_4_ = 0;
  do {
    if (0x81 < p._4_4_) {
      return 0;
    }
    local_30 = (byte *)mimeencs[p._4_4_].name;
    q = name;
    while( true ) {
      bVar3 = true;
      if (*q == '\0') {
        bVar3 = *local_30 != 0;
      }
      if (!bVar3) break;
      iVar1 = tolower((uint)(byte)*q);
      iVar2 = tolower((uint)*local_30);
      if (iVar1 != iVar2) break;
      q = q + 1;
      local_30 = local_30 + 1;
    }
    if ((*q == '\0') && (*local_30 == 0)) {
      return mimeencs[p._4_4_].charset;
    }
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

int charset_from_mimeenc(const char *name)
{
    int i;

    for (i = 0; i < (int)lenof(mimeencs); i++) {
        const char *p, *q;
        p = name;
        q = mimeencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return mimeencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}